

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O1

void * NES_APU_np_Create(UINT32 clock,UINT32 rate)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  NES_APU *apu;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  pvVar1 = calloc(1,0x178);
  if (pvVar1 == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else {
    uVar4 = 0xac44;
    if (rate != 0) {
      uVar4 = (ulong)rate;
    }
    *(UINT32 *)((long)pvVar1 + 0x60) = clock;
    *(int *)((long)pvVar1 + 0x5c) = (int)uVar4;
    *(ulong *)((long)pvVar1 + 0x168) = (uVar4 >> 1 | (ulong)clock << 0x20) / uVar4;
    *(undefined8 *)((long)pvVar1 + 8) = 0x100000001;
    *(undefined4 *)((long)pvVar1 + 0x10) = 1;
    *(undefined8 *)((long)pvVar1 + 0x14) = 0;
    *(undefined4 *)((long)pvVar1 + 100) = 0;
    lVar2 = 0x1a;
    do {
      *(int *)((long)pvVar1 + lVar2 * 4) =
           (int)(785448.96 / (8128.0 / (double)((int)lVar2 + -0x19) + 100.0));
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x39);
    *(undefined4 *)((long)pvVar1 + 0xe4) = *(undefined4 *)((long)pvVar1 + 0xa0);
    lVar3 = (long)pvVar1 + 0x20;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        *(undefined4 *)(lVar3 + lVar5 * 4) = 0x80;
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      lVar3 = lVar3 + 8;
      bVar6 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar6);
    *(undefined4 *)((long)pvVar1 + 0x1c) = 0;
  }
  return pvVar1;
}

Assistant:

void* NES_APU_np_Create(UINT32 clock, UINT32 rate)
{
	NES_APU* apu;
	int i, c, t;

	apu = (NES_APU*)calloc(1, sizeof(NES_APU));
	if (apu == NULL)
		return NULL;

	NES_APU_np_SetClock(apu, clock);
	NES_APU_np_SetRate(apu, rate);
	apu->option[OPT_UNMUTE_ON_RESET] = true;
	apu->option[OPT_PHASE_REFRESH] = true;
	apu->option[OPT_NONLINEAR_MIXER] = true;
	apu->option[OPT_DUTY_SWAP] = false;
	apu->option[OPT_NEGATE_SWEEP_INIT] = false;

	apu->square_table[0] = 0;
	for(i=1;i<32;i++)
		apu->square_table[i]=(INT32)((8192.0*95.88)/(8128.0/i+100));

	apu->square_linear = apu->square_table[15]; // match linear scale to one full volume square of nonlinear

	for(c=0;c<2;++c)
		for(t=0;t<2;++t)
			apu->sm[c][t] = 128;

	apu->mask = 0;

	return apu;
}